

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithQueryDepsLogTestTwoOutputsDepFileGCCOnlyMainOutput::Run
          (BuildWithQueryDepsLogTestTwoOutputsDepFileGCCOnlyMainOutput *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference __rhs;
  string *psVar7;
  Deps *pDVar8;
  Deps *out2_deps;
  Node *local_f0;
  Node *out2_node;
  Deps *out1_deps;
  Node *local_d0;
  Node *out1_node;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  int fail_count;
  BuildWithQueryDepsLogTestTwoOutputsDepFileGCCOnlyMainOutput *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
               super_StateTestWithBuiltinRules.state_,
              "rule cp_multi_gcc\n    command = echo \'out1: $in\' > in.d && for file in $out; do cp in1 $$file; done\n    deps = gcc\n    depfile = in.d\nbuild out1 out2: cp_multi_gcc in1 in2\n"
              ,stack0xffffffffffffffe4);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    std::__cxx11::string::string((string *)local_40);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out1",&local_61);
    pNVar5 = Builder::AddTarget(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.builder_,
                                &local_60,(string *)local_40);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x7ed,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x7ee,"\"\" == err");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in.d",&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"out1: in1 in2",(allocator<char> *)((long)&out1_node + 7));
      VirtualFileSystem::Create
                (&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.fs_,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&out1_node + 7));
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      pTVar1 = g_current_test;
      bVar2 = Builder::Build(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.builder_,
                             (string *)local_40);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7f0,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x7f1,"\"\" == err");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.command_runner_.
                      commands_ran_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar6 == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x7f2,"1u == command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
                              command_runner_.commands_ran_,0);
        bVar2 = std::operator==("echo \'out1: in1 in2\' > in.d && for file in out1 out2; do cp in1 $file; done"
                                ,__rhs);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7f3,
                   "\"echo \'out1: in1 in2\' > in.d && for file in out1 out2; do cp in1 $file; done\" == command_runner_.commands_ran_[0]"
                  );
        StringPiece::StringPiece((StringPiece *)&out1_deps,"out1");
        local_d0 = State::LookupNode(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
                                      super_StateTestWithBuiltinRules.state_,_out1_deps);
        out2_node = (Node *)DepsLog::GetDeps(&(this->super_BuildWithQueryDepsLogTest).log_,local_d0)
        ;
        testing::Test::Check
                  (g_current_test,(int)(out2_node->path_)._M_string_length == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7f7,"2 == out1_deps->node_count");
        pTVar1 = g_current_test;
        psVar7 = Node::path_abi_cxx11_((Node *)**(undefined8 **)&(out2_node->path_).field_2);
        bVar2 = std::operator==("in1",psVar7);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7f8,"\"in1\" == out1_deps->nodes[0]->path()");
        pTVar1 = g_current_test;
        psVar7 = Node::path_abi_cxx11_
                           (*(Node **)((out2_node->path_).field_2._M_allocated_capacity + 8));
        bVar2 = std::operator==("in2",psVar7);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7f9,"\"in2\" == out1_deps->nodes[1]->path()");
        StringPiece::StringPiece((StringPiece *)&out2_deps,"out2");
        local_f0 = State::LookupNode(&(this->super_BuildWithQueryDepsLogTest).super_BuildTest.
                                      super_StateTestWithBuiltinRules.state_,_out2_deps);
        pDVar8 = DepsLog::GetDeps(&(this->super_BuildWithQueryDepsLogTest).log_,local_f0);
        testing::Test::Check
                  (g_current_test,pDVar8->node_count == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7fd,"2 == out2_deps->node_count");
        pTVar1 = g_current_test;
        psVar7 = Node::path_abi_cxx11_(*pDVar8->nodes);
        bVar2 = std::operator==("in1",psVar7);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7fe,"\"in1\" == out2_deps->nodes[0]->path()");
        pTVar1 = g_current_test;
        psVar7 = Node::path_abi_cxx11_(pDVar8->nodes[1]);
        bVar2 = std::operator==("in2",psVar7);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x7ff,"\"in2\" == out2_deps->nodes[1]->path()");
        local_78 = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_78 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_78 = 1;
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildWithQueryDepsLogTest, TwoOutputsDepFileGCCOnlyMainOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cp_multi_gcc\n"
"    command = echo 'out1: $in' > in.d && for file in $out; do cp in1 $$file; done\n"
"    deps = gcc\n"
"    depfile = in.d\n"
"build out1 out2: cp_multi_gcc in1 in2\n"));

  std::string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  fs_.Create("in.d", "out1: in1 in2");
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("echo 'out1: in1 in2' > in.d && for file in out1 out2; do cp in1 $file; done", command_runner_.commands_ran_[0]);

  Node* out1_node = state_.LookupNode("out1");
  DepsLog::Deps* out1_deps = log_.GetDeps(out1_node);
  EXPECT_EQ(2, out1_deps->node_count);
  EXPECT_EQ("in1", out1_deps->nodes[0]->path());
  EXPECT_EQ("in2", out1_deps->nodes[1]->path());

  Node* out2_node = state_.LookupNode("out2");
  DepsLog::Deps* out2_deps = log_.GetDeps(out2_node);
  EXPECT_EQ(2, out2_deps->node_count);
  EXPECT_EQ("in1", out2_deps->nodes[0]->path());
  EXPECT_EQ("in2", out2_deps->nodes[1]->path());
}